

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

TRef crec_reassoc_ofs(jit_State *J,TRef tr,ptrdiff_t *ofsp,MSize sz)

{
  IRIns *pIVar1;
  IRIns *pIVar2;
  ptrdiff_t k;
  IRIns *irk;
  IRIns *ir;
  MSize sz_local;
  ptrdiff_t *ofsp_local;
  TRef tr_local;
  jit_State *J_local;
  
  pIVar1 = (J->cur).ir + (tr & 0xffff);
  tr_local = tr;
  if ((((J->flags & 0x10000) != 0) && ((pIVar1->field_0).op2 < 0x8000)) &&
     (((pIVar1->field_1).o == ')' || (((pIVar1->field_1).o == '5' || ((pIVar1->field_1).o == '6'))))
     )) {
    pIVar2 = (J->cur).ir + (pIVar1->field_0).op2;
    if ((pIVar2->field_1).o == '\x1d') {
      k = (long)pIVar2[1] * (ulong)sz;
    }
    else {
      k = (long)pIVar2->i * (ulong)sz;
    }
    if ((pIVar1->field_1).o == '6') {
      *ofsp = *ofsp - k;
    }
    else {
      *ofsp = k + *ofsp;
    }
    tr_local = (TRef)(pIVar1->field_0).op1;
  }
  return tr_local;
}

Assistant:

static TRef crec_reassoc_ofs(jit_State *J, TRef tr, ptrdiff_t *ofsp, MSize sz)
{
  IRIns *ir = IR(tref_ref(tr));
  if (LJ_LIKELY(J->flags & JIT_F_OPT_FOLD) && irref_isk(ir->op2) &&
      (ir->o == IR_ADD || ir->o == IR_ADDOV || ir->o == IR_SUBOV)) {
    IRIns *irk = IR(ir->op2);
    ptrdiff_t k;
    if (LJ_64 && irk->o == IR_KINT64)
      k = (ptrdiff_t)ir_kint64(irk)->u64 * sz;
    else
      k = (ptrdiff_t)irk->i * sz;
    if (ir->o == IR_SUBOV) *ofsp -= k; else *ofsp += k;
    tr = ir->op1;  /* Not a TRef, but the caller doesn't care. */
  }
  return tr;
}